

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall
mpt::content<mpt::item<mpt::layout::graph>_>::set_length
          (content<mpt::item<mpt::layout::graph>_> *this,long len)

{
  ulong pos;
  void *pvVar1;
  uint8_t *ptr;
  size_t set;
  long len_local;
  content<mpt::item<mpt::layout::graph>_> *this_local;
  
  pos = len * 0x20;
  if (pos == (this->super_buffer)._used) {
    this_local._7_1_ = true;
  }
  else if (pos < (this->super_buffer)._used) {
    this_local._7_1_ = buffer::trim(&this->super_buffer,(this->super_buffer)._used + len * -0x20);
  }
  else {
    pvVar1 = buffer::insert(&this->super_buffer,pos,0);
    this_local._7_1_ = pvVar1 != (void *)0x0;
  }
  return this_local._7_1_;
}

Assistant:

bool set_length(long len)
	{
		size_t set = len * sizeof(T);
		if (set == _used) {
			return true;
		}
		if (set < _used) {
			return buffer::trim(_used - set);
		}
		/* data before offset gets initialized */
		uint8_t *ptr = static_cast<uint8_t *>(buffer::insert(set, 0));
		return ptr ? true : false;
	}